

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

QWidget * __thiscall QToolBox::widget(QToolBox *this,int index)

{
  QToolBoxPrivate *pQVar1;
  size_type sVar2;
  pointer pPVar3;
  int in_ESI;
  vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
  *in_RDI;
  QToolBoxPrivate *d;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  
  pQVar1 = d_func((QToolBox *)0x703e9b);
  if ((-1 < in_ESI) &&
     (iVar4 = in_ESI,
     sVar2 = std::
             vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ::size(&pQVar1->pageList), in_ESI < (int)sVar2)) {
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::operator[](in_RDI,CONCAT44(iVar4,in_stack_ffffffffffffffe8));
    pPVar3 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
             operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                         *)0x703ef4);
    return pPVar3->widget;
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QToolBox::widget(int index) const
{
    Q_D(const QToolBox);
    if (index < 0 || index >= static_cast<int>(d->pageList.size()))
        return nullptr;
    return d->pageList[index]->widget;
}